

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void state_DCL(Context *ctx)

{
  RegisterType rtype;
  int regnum;
  RegisterList *pRVar1;
  MOJOSHADER_samplerMap *pMVar2;
  char *pcVar3;
  ulong uVar4;
  MOJOSHADER_usage usage;
  
  rtype = (ctx->dest_arg).regtype;
  regnum = (ctx->dest_arg).regnum;
  if (ctx->instruction_count != 0) {
    failf(ctx,"%s","DCL token must come before any instructions");
    goto LAB_00112ce6;
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    usage = ctx->dwords[0];
    if (rtype != REG_TYPE_SAMPLER) {
LAB_00112dda:
      add_attribute_register
                (ctx,rtype,regnum,usage,ctx->dwords[1],(ctx->dest_arg).writemask,
                 (ctx->dest_arg).result_mod);
      goto LAB_00112ce6;
    }
    pRVar1 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    pMVar2 = ctx->samplermap;
    if ((pMVar2 != (MOJOSHADER_samplerMap *)0x0) && ((ulong)ctx->samplermap_count != 0)) {
      uVar4 = 0;
      do {
        if (pMVar2[uVar4].index == regnum) goto LAB_00112e1b;
        uVar4 = uVar4 + 1;
      } while (ctx->samplermap_count != uVar4);
    }
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      pcVar3 = "unsupported shader type.";
LAB_00112e07:
      failf(ctx,"%s",pcVar3);
      return;
    }
    usage = ctx->dwords[0];
    if (rtype != REG_TYPE_SAMPLER) {
      if (MOJOSHADER_USAGE_SAMPLE < usage) {
        pcVar3 = "unknown DCL usage";
        goto LAB_00112e07;
      }
      goto LAB_00112dda;
    }
    pRVar1 = reglist_insert(ctx,&ctx->samplers,REG_TYPE_SAMPLER,regnum);
    pMVar2 = ctx->samplermap;
    if ((pMVar2 != (MOJOSHADER_samplerMap *)0x0) && ((ulong)ctx->samplermap_count != 0)) {
      uVar4 = 0;
      do {
        if (pMVar2[uVar4].index == regnum) goto LAB_00112e1b;
        uVar4 = uVar4 + 1;
      } while (ctx->samplermap_count != uVar4);
    }
  }
  goto LAB_00112e24;
LAB_00112e1b:
  usage = pMVar2[uVar4].type + MOJOSHADER_SAMPLER_VOLUME;
LAB_00112e24:
  pRVar1->index = usage;
LAB_00112ce6:
  reglist_insert(ctx,&ctx->defined_registers,rtype,regnum);
  return;
}

Assistant:

static void state_DCL(Context *ctx)
{
    const DestArgInfo *arg = &ctx->dest_arg;
    const RegisterType regtype = arg->regtype;
    const int regnum = arg->regnum;
    const int wmask = arg->writemask;
    const int mods = arg->result_mod;

    // parse_args_DCL() does a lot of state checking before we get here.

    // !!! FIXME: apparently vs_3_0 can use sampler registers now.
    // !!! FIXME:  (but only s0 through s3, not all 16 of them.)

    if (ctx->instruction_count != 0)
        fail(ctx, "DCL token must come before any instructions");

    else if (shader_is_vertex(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (const MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            if (usage >= MOJOSHADER_USAGE_TOTAL)
            {
                fail(ctx, "unknown DCL usage");
                return;
            } // if
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        if (regtype == REG_TYPE_SAMPLER)
            add_sampler(ctx, regnum, (TextureType) ctx->dwords[0], 0);
        else
        {
            const MOJOSHADER_usage usage = (MOJOSHADER_usage) ctx->dwords[0];
            const int index = ctx->dwords[1];
            add_attribute_register(ctx, regtype, regnum, usage, index, wmask, mods);
        } // else
    } // else if

    else
    {
        fail(ctx, "unsupported shader type."); // should be caught elsewhere.
        return;
    } // else

    set_defined_register(ctx, regtype, regnum);
}